

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::SPxScaler<double>::getRowUnscaled
          (SPxScaler<double> *this,SPxLPBase<double> *lp,int i,DSVectorBase<double> *vec)

{
  int iVar1;
  undefined4 uVar2;
  SVectorBase<double> *this_00;
  char *pcVar3;
  undefined8 in_RCX;
  int in_EDX;
  int __c;
  int __c_00;
  long in_RSI;
  int j;
  SVectorBase<double> *row;
  int exp2;
  int exp1;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  int in_stack_ffffffffffffff8c;
  SPxLPBase<double> *in_stack_ffffffffffffff90;
  DataArray<int> *this_01;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  undefined4 local_44;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),in_EDX);
  this_00 = SPxLPBase<double>::rowVector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  SVectorBase<double>::size(this_00);
  DSVectorBase<double>::setMax
            ((DSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             iVar1);
  SVectorBase<double>::clear((SVectorBase<double> *)0x29a962);
  local_44 = 0;
  while( true ) {
    uVar4 = local_44;
    iVar1 = SVectorBase<double>::size(this_00);
    if (iVar1 <= (int)uVar4) break;
    this_01 = (DataArray<int> *)(in_RSI + 0x178);
    pcVar3 = SVectorBase<double>::index(this_00,(char *)(ulong)local_44,__c);
    DataArray<int>::operator[](this_01,(int)pcVar3);
    iVar1 = (int)((ulong)in_RCX >> 0x20);
    pcVar3 = SVectorBase<double>::index(this_00,(char *)(ulong)local_44,__c_00);
    uVar2 = SUB84(pcVar3,0);
    SVectorBase<double>::value(this_00,local_44);
    spxLdexp((Real)this_01,in_stack_ffffffffffffff8c);
    DSVectorBase<double>::add((DSVectorBase<double> *)CONCAT44(uVar4,uVar2),iVar1,(double *)this_01)
    ;
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

void SPxScaler<R>::getRowUnscaled(const SPxLPBase<R>& lp, int i, DSVectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(i < lp.nRows());
   assert(i >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
   int exp1;
   int exp2 = rowscaleExp[i];

   const SVectorBase<R>& row = lp.rowVector(i);
   vec.setMax(row.size());
   vec.clear();

   for(int j = 0; j < row.size(); j++)
   {
      exp1 = colscaleExp[row.index(j)];
      vec.add(row.index(j), spxLdexp(row.value(j), -exp1 - exp2));
   }
}